

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O2

void deflate_flush_block(libdeflate_compressor *c,deflate_output_bitstream *os,u8 *block_begin,
                        u32 block_length,deflate_sequence *sequences,_Bool is_final_block)

{
  byte *pbVar1;
  ushort uVar2;
  u32 uVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  u8 *puVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong *puVar15;
  size_t __n;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  deflate_codes *pdVar20;
  undefined1 *puVar21;
  ushort *puVar22;
  ulong *puVar23;
  uint uVar24;
  uint uVar25;
  
  uVar16 = os->bitbuf;
  uVar24 = os->bitcount;
  puVar23 = (ulong *)os->next;
  puVar8 = os->end;
  lVar6 = (long)puVar8 - (long)puVar23;
  lVar7 = 7;
  if (lVar6 < 7) {
    lVar7 = lVar6;
  }
  deflate_precompute_huffman_header(c);
  uVar25 = (c->o).precode.num_explicit_lens;
  iVar10 = uVar25 * 3 + 0x11;
  for (lVar6 = 0; lVar6 != 0x13; lVar6 = lVar6 + 1) {
    iVar10 = iVar10 + ((uint)*(byte *)((long)&c->o + lVar6 + 0x98) + (uint)""[lVar6]) *
                      *(int *)((long)&c->o + lVar6 * 4);
  }
  puVar15 = (ulong *)(puVar8 + -lVar7);
  iVar18 = 3;
  for (lVar7 = -0x90; lVar7 != 0; lVar7 = lVar7 + 1) {
    uVar3 = (c->freqs).litlen[lVar7 + 0x90];
    iVar10 = iVar10 + (c->codes).lens.litlen[lVar7 + 0x90] * uVar3;
    iVar18 = iVar18 + uVar3 * 8;
  }
  puVar8 = block_begin + block_length;
  for (lVar7 = -0x70; lVar7 != 0; lVar7 = lVar7 + 1) {
    uVar3 = (c->freqs).offset[lVar7 + -0x20];
    iVar10 = iVar10 + (c->codes).lens.offset[lVar7 + -0x20] * uVar3;
    iVar18 = iVar18 + uVar3 * 9;
  }
  uVar11 = iVar10 + (uint)(c->codes).lens.litlen[0x100];
  uVar19 = iVar18 + 7;
  for (lVar7 = 0; lVar7 != 0x1d; lVar7 = lVar7 + 1) {
    uVar3 = (c->freqs).offset[lVar7 + -0x1f];
    uVar11 = uVar11 + ((uint)(c->codes).lens.offset[lVar7 + -0x1f] + (uint)""[lVar7]) * uVar3;
    uVar19 = uVar19 + ((uint)(c->static_codes).lens.offset[lVar7 + -0x1f] + (uint)""[lVar7]) * uVar3
    ;
  }
  for (lVar7 = 0; lVar7 != 0x1e; lVar7 = lVar7 + 1) {
    uVar3 = (c->freqs).offset[lVar7];
    uVar11 = uVar11 + ((uint)(c->codes).lens.offset[lVar7] + (uint)""[lVar7]) * uVar3;
    uVar19 = uVar19 + (""[lVar7] + 5) * uVar3;
  }
  uVar13 = ((5 - uVar24 & 7) + ((block_length + 0xfffe) / 0xffff) * 0x28 + block_length * 8) - 5;
  uVar5 = uVar13;
  if (uVar19 < uVar13) {
    uVar5 = uVar19;
  }
  if (uVar11 < uVar5) {
    uVar5 = uVar11;
  }
  if ((long)os->end - (long)puVar23 < (long)(ulong)(uVar5 + uVar24 + 7 >> 3)) {
    os->overflow = true;
  }
  else {
    if (uVar5 == uVar13) {
      do {
        __n = (long)puVar8 - (long)block_begin;
        bVar4 = (long)__n < 0x10000;
        if (0xffff < (long)__n) {
          __n = 0xffff;
        }
        *(byte *)puVar23 = (byte)uVar16 | (bVar4 && is_final_block) << ((byte)uVar24 & 0x1f);
        if (uVar24 < 6) {
          puVar22 = (ushort *)((long)puVar23 + 1);
        }
        else {
          *(undefined1 *)((long)puVar23 + 1) = 0;
          puVar22 = (ushort *)((long)puVar23 + 2);
        }
        *puVar22 = (ushort)__n;
        puVar22[1] = ~(ushort)__n;
        memcpy(puVar22 + 2,block_begin,__n);
        puVar23 = (ulong *)((long)puVar22 + __n + 4);
        block_begin = block_begin + __n;
        uVar24 = 0;
        uVar16 = 0;
        uVar14 = 0;
      } while (block_begin != puVar8);
    }
    else {
      bVar9 = (byte)uVar24;
      if (uVar5 == uVar19) {
        pdVar20 = &c->static_codes;
        uVar16 = (ulong)is_final_block << (bVar9 & 0x3f) | 1L << ((ulong)(uVar24 + 1) & 0x3f) |
                 uVar16;
        uVar24 = uVar24 + 3;
        if (puVar23 < puVar15) {
          *puVar23 = uVar16;
          uVar16 = uVar16 >> ((byte)uVar24 & 0x38);
          puVar23 = (ulong *)((long)puVar23 + (ulong)(uVar24 >> 3));
          uVar24 = uVar24 & 7;
        }
        else {
          for (; 7 < uVar24; uVar24 = uVar24 - 8) {
            *(char *)puVar23 = (char)uVar16;
            puVar23 = (ulong *)((long)puVar23 + 1);
            uVar16 = uVar16 >> 8;
          }
        }
      }
      else {
        uVar11 = (c->o).precode.num_items;
        uVar16 = (ulong)(c->o).precode.lens[0x10] << (bVar9 + 0x11 & 0x3f) |
                 (ulong)((c->o).precode.num_offset_syms - 1) << (bVar9 + 8 & 0x3f) |
                 (ulong)(uVar25 - 4) << (bVar9 + 0xd & 0x3f) |
                 2L << (bVar9 + 1 & 0x3f) | (ulong)is_final_block << (bVar9 & 0x3f) |
                 (ulong)((c->o).precode.num_litlen_syms - 0x101) << (bVar9 + 3 & 0x3f) | uVar16;
        uVar24 = uVar24 + 0x14;
        if (puVar23 < puVar15) {
          *puVar23 = uVar16;
          uVar16 = uVar16 >> ((byte)uVar24 & 0x38);
          puVar23 = (ulong *)((long)puVar23 + (ulong)(uVar24 >> 3));
          uVar24 = uVar24 & 7;
        }
        else {
          for (; 7 < uVar24; uVar24 = uVar24 - 8) {
            *(char *)puVar23 = (char)uVar16;
            puVar23 = (ulong *)((long)puVar23 + 1);
            uVar16 = uVar16 >> 8;
          }
        }
        pdVar20 = &c->codes;
        uVar14 = 1;
        do {
          uVar16 = uVar16 | (ulong)*(byte *)((long)&c->o + (ulong)"\x10\x11\x12"[uVar14] + 0x98) <<
                            ((byte)uVar24 & 0x3f);
          uVar24 = uVar24 + 3;
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar25);
        if (puVar23 < puVar15) {
          *puVar23 = uVar16;
          uVar16 = uVar16 >> ((byte)uVar24 & 0x38);
          puVar23 = (ulong *)((long)puVar23 + (ulong)(uVar24 >> 3));
          uVar24 = uVar24 & 7;
        }
        else {
          for (; 7 < uVar24; uVar24 = uVar24 - 8) {
            *(char *)puVar23 = (char)uVar16;
            puVar23 = (ulong *)((long)puVar23 + 1);
            uVar16 = uVar16 >> 8;
          }
        }
        uVar14 = 0;
        do {
          uVar25 = *(uint *)((long)&c->o + uVar14 * 4 + 0xac);
          uVar17 = (ulong)(uVar25 & 0x1f);
          iVar10 = *(byte *)((long)&c->o + uVar17 + 0x98) + uVar24;
          uVar16 = (ulong)(uVar25 >> 5) << ((byte)iVar10 & 0x3f) |
                   (ulong)*(uint *)((long)&c->o + uVar17 * 4 + 0x4c) << ((byte)uVar24 & 0x3f) |
                   uVar16;
          uVar24 = (uint)""[uVar17] + iVar10;
          if (puVar23 < puVar15) {
            *puVar23 = uVar16;
            uVar16 = uVar16 >> ((byte)uVar24 & 0x38);
            puVar23 = (ulong *)((long)puVar23 + (ulong)(uVar24 >> 3));
            uVar24 = uVar24 & 7;
          }
          else {
            for (; 7 < uVar24; uVar24 = uVar24 - 8) {
              *(char *)puVar23 = (char)uVar16;
              puVar23 = (ulong *)((long)puVar23 + 1);
              uVar16 = uVar16 >> 8;
            }
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar11);
      }
      for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
        bVar9 = ""[lVar7 + 3];
        *(u32 *)((long)&c->o + lVar7 * 4 + 0xc) =
             ((int)lVar7 - deflate_length_slot_base[bVar9]) + 3 <<
             ((pdVar20->lens).offset[(ulong)bVar9 - 0x1f] & 0x1f) |
             (pdVar20->codewords).offset[(ulong)bVar9 - 0x1f];
        *(u8 *)((long)&c->o + lVar7 + 0x40f) =
             ""[bVar9] + (pdVar20->lens).offset[(ulong)bVar9 - 0x1f];
      }
      if (sequences == (deflate_sequence *)0x0) {
        puVar21 = (undefined1 *)((long)&c->p + 0x639584);
        do {
          uVar14 = (ulong)(*(uint *)(puVar21 + 4) & 0x1ff);
          uVar25 = *(uint *)(puVar21 + 4) >> 9;
          uVar17 = (ulong)uVar25;
          if (uVar14 == 1) {
            uVar16 = (ulong)(pdVar20->codewords).litlen[uVar17] << ((byte)uVar24 & 0x3f) | uVar16;
            uVar24 = (pdVar20->lens).litlen[uVar17] + uVar24;
            if (puVar23 < puVar15) {
LAB_0010756d:
              *puVar23 = uVar16;
              uVar16 = uVar16 >> ((byte)uVar24 & 0x38);
              puVar23 = (ulong *)((long)puVar23 + (ulong)(uVar24 >> 3));
              uVar24 = uVar24 & 7;
            }
            else {
              for (; 7 < uVar24; uVar24 = uVar24 - 8) {
                *(char *)puVar23 = (char)uVar16;
                puVar23 = (ulong *)((long)puVar23 + 1);
                uVar16 = uVar16 >> 8;
              }
            }
          }
          else {
            bVar9 = *(byte *)((long)&c->p + uVar17 + 0x88e1dc);
            iVar10 = *(byte *)((long)&c->o + uVar14 + 0x40c) + uVar24;
            iVar18 = (uint)(pdVar20->lens).offset[bVar9] + iVar10;
            uVar16 = (ulong)(uVar25 - deflate_offset_slot_base[bVar9]) << ((byte)iVar18 & 0x3f) |
                     (ulong)(pdVar20->codewords).offset[bVar9] << ((byte)iVar10 & 0x3f) |
                     (ulong)*(uint *)((long)&c->o + uVar14 * 4) << ((byte)uVar24 & 0x3f) | uVar16;
            uVar24 = (uint)""[bVar9] + iVar18;
            if (puVar23 < puVar15) goto LAB_0010756d;
            for (; 7 < uVar24; uVar24 = uVar24 - 8) {
              *(char *)puVar23 = (char)uVar16;
              puVar23 = (ulong *)((long)puVar23 + 1);
              uVar16 = uVar16 >> 8;
            }
          }
          puVar21 = puVar21 + uVar14 * 8;
        } while (puVar21 != (undefined1 *)((long)&c->p + (ulong)block_length * 8 + 0x639584));
      }
      else {
        while( true ) {
          uVar25 = sequences->litrunlen_and_length;
          uVar19 = uVar25 & 0x7fffff;
          for (uVar11 = uVar19; 3 < uVar11; uVar11 = uVar11 - 4) {
            iVar18 = (pdVar20->lens).litlen[*block_begin] + uVar24;
            iVar10 = (uint)(pdVar20->lens).litlen[block_begin[1]] + iVar18;
            iVar12 = (uint)(pdVar20->lens).litlen[block_begin[2]] + iVar10;
            uVar16 = (ulong)(pdVar20->codewords).litlen[block_begin[3]] << ((byte)iVar12 & 0x3f) |
                     (ulong)(pdVar20->codewords).litlen[block_begin[2]] << ((byte)iVar10 & 0x3f) |
                     (ulong)(pdVar20->codewords).litlen[block_begin[1]] << ((byte)iVar18 & 0x3f) |
                     (ulong)(pdVar20->codewords).litlen[*block_begin] << ((byte)uVar24 & 0x3f) |
                     uVar16;
            uVar24 = (uint)(pdVar20->lens).litlen[block_begin[3]] + iVar12;
            if (puVar23 < puVar15) {
              *puVar23 = uVar16;
              uVar16 = uVar16 >> ((byte)uVar24 & 0x38);
              puVar23 = (ulong *)((long)puVar23 + (ulong)(uVar24 >> 3));
              uVar24 = uVar24 & 7;
            }
            else {
              for (; 7 < uVar24; uVar24 = uVar24 - 8) {
                *(char *)puVar23 = (char)uVar16;
                puVar23 = (ulong *)((long)puVar23 + 1);
                uVar16 = uVar16 >> 8;
              }
            }
            block_begin = block_begin + 4;
          }
          iVar10 = uVar19 - (uVar25 & 0x7ffffc);
          if (uVar19 != (uVar25 & 0x7ffffc)) {
            uVar16 = (ulong)(pdVar20->codewords).litlen[*block_begin] << ((byte)uVar24 & 0x3f) |
                     uVar16;
            uVar24 = (pdVar20->lens).litlen[*block_begin] + uVar24;
            if (iVar10 == 1) {
              block_begin = block_begin + 1;
            }
            else {
              uVar16 = uVar16 | (ulong)(pdVar20->codewords).litlen[block_begin[1]] <<
                                ((byte)uVar24 & 0x3f);
              uVar24 = uVar24 + (pdVar20->lens).litlen[block_begin[1]];
              if (iVar10 == 2) {
                block_begin = block_begin + 2;
              }
              else {
                pbVar1 = block_begin + 2;
                block_begin = block_begin + 3;
                uVar16 = uVar16 | (ulong)(pdVar20->codewords).litlen[*pbVar1] <<
                                  ((byte)uVar24 & 0x3f);
                uVar24 = uVar24 + (pdVar20->lens).litlen[*pbVar1];
              }
            }
            if (puVar23 < puVar15) {
              *puVar23 = uVar16;
              uVar16 = uVar16 >> ((byte)uVar24 & 0x38);
              puVar23 = (ulong *)((long)puVar23 + (ulong)(uVar24 >> 3));
              uVar24 = uVar24 & 7;
            }
            else {
              for (; 7 < uVar24; uVar24 = uVar24 - 8) {
                *(char *)puVar23 = (char)uVar16;
                puVar23 = (ulong *)((long)puVar23 + 1);
                uVar16 = uVar16 >> 8;
              }
            }
          }
          if (uVar25 < 0x800000) break;
          uVar14 = (ulong)(uVar25 >> 0x17);
          uVar2 = sequences->offset_slot;
          iVar18 = *(byte *)((long)&c->o + uVar14 + 0x40c) + uVar24;
          iVar10 = (uint)(pdVar20->lens).offset[uVar2] + iVar18;
          uVar16 = (ulong)((uint)sequences->offset - deflate_offset_slot_base[uVar2]) <<
                   ((byte)iVar10 & 0x3f) |
                   (ulong)(pdVar20->codewords).offset[uVar2] << ((byte)iVar18 & 0x3f) |
                   (ulong)*(uint *)((long)&c->o + uVar14 * 4) << ((byte)uVar24 & 0x3f) | uVar16;
          uVar24 = (uint)""[uVar2] + iVar10;
          if (puVar23 < puVar15) {
            *puVar23 = uVar16;
            uVar16 = uVar16 >> ((byte)uVar24 & 0x38);
            puVar23 = (ulong *)((long)puVar23 + (ulong)(uVar24 >> 3));
            uVar24 = uVar24 & 7;
          }
          else {
            for (; 7 < uVar24; uVar24 = uVar24 - 8) {
              *(char *)puVar23 = (char)uVar16;
              puVar23 = (ulong *)((long)puVar23 + 1);
              uVar16 = uVar16 >> 8;
            }
          }
          block_begin = block_begin + uVar14;
          sequences = sequences + 1;
        }
      }
      uVar14 = (ulong)(pdVar20->codewords).litlen[0x100] << ((byte)uVar24 & 0x3f) | uVar16;
      uVar24 = (pdVar20->lens).litlen[0x100] + uVar24;
      if (puVar23 < puVar15) {
        *puVar23 = uVar14;
        uVar14 = uVar14 >> ((byte)uVar24 & 0x38);
        puVar23 = (ulong *)((long)puVar23 + (ulong)(uVar24 >> 3));
        uVar24 = uVar24 & 7;
      }
      else {
        for (; 7 < uVar24; uVar24 = uVar24 - 8) {
          *(char *)puVar23 = (char)uVar14;
          puVar23 = (ulong *)((long)puVar23 + 1);
          uVar14 = uVar14 >> 8;
        }
      }
    }
    os->bitbuf = uVar14;
    os->bitcount = uVar24;
    os->next = (u8 *)puVar23;
  }
  return;
}

Assistant:

void
deflate_flush_block(struct libdeflate_compressor *c,
		    struct deflate_output_bitstream *os,
		    const u8 *block_begin, u32 block_length,
		    const struct deflate_sequence *sequences,
		    bool is_final_block)
{
	/*
	 * It is hard to get compilers to understand that writes to 'os->next'
	 * don't alias 'os'.  That hurts performance significantly, as
	 * everything in 'os' would keep getting re-loaded.  ('restrict'
	 * *should* do the trick, but it's unreliable.)  Therefore, we keep all
	 * the output bitstream state in local variables, and output bits using
	 * macros.  This is similar to what the decompressor does.
	 */
	const u8 *in_next = block_begin;
	const u8 * const in_end = block_begin + block_length;
	bitbuf_t bitbuf = os->bitbuf;
	unsigned bitcount = os->bitcount;
	u8 *out_next = os->next;
	u8 * const out_fast_end =
		os->end - MIN(WORDBYTES - 1, os->end - out_next);
	/*
	 * The cost for each block type, in bits.  Start with the cost of the
	 * block header which is 3 bits.
	 */
	u32 dynamic_cost = 3;
	u32 static_cost = 3;
	u32 uncompressed_cost = 3;
	u32 best_cost;
	struct deflate_codes *codes;
	unsigned sym;

	ASSERT(block_length >= MIN_BLOCK_LENGTH ||
	       (is_final_block && block_length > 0));
	ASSERT(block_length <= MAX_BLOCK_LENGTH);
	ASSERT(bitcount <= 7);
	ASSERT((bitbuf & ~(((bitbuf_t)1 << bitcount) - 1)) == 0);
	ASSERT(out_next <= os->end);
	ASSERT(!os->overflow);

	/* Precompute the precode items and build the precode. */
	deflate_precompute_huffman_header(c);

	/* Account for the cost of encoding dynamic Huffman codes. */
	dynamic_cost += 5 + 5 + 4 + (3 * c->o.precode.num_explicit_lens);
	for (sym = 0; sym < DEFLATE_NUM_PRECODE_SYMS; sym++) {
		u32 extra = deflate_extra_precode_bits[sym];

		dynamic_cost += c->o.precode.freqs[sym] *
				(extra + c->o.precode.lens[sym]);
	}

	/* Account for the cost of encoding literals. */
	for (sym = 0; sym < 144; sym++) {
		dynamic_cost += c->freqs.litlen[sym] *
				c->codes.lens.litlen[sym];
		static_cost += c->freqs.litlen[sym] * 8;
	}
	for (; sym < 256; sym++) {
		dynamic_cost += c->freqs.litlen[sym] *
				c->codes.lens.litlen[sym];
		static_cost += c->freqs.litlen[sym] * 9;
	}

	/* Account for the cost of encoding the end-of-block symbol. */
	dynamic_cost += c->codes.lens.litlen[DEFLATE_END_OF_BLOCK];
	static_cost += 7;

	/* Account for the cost of encoding lengths. */
	for (sym = DEFLATE_FIRST_LEN_SYM;
	     sym < DEFLATE_FIRST_LEN_SYM + ARRAY_LEN(deflate_extra_length_bits);
	     sym++) {
		u32 extra = deflate_extra_length_bits[
					sym - DEFLATE_FIRST_LEN_SYM];

		dynamic_cost += c->freqs.litlen[sym] *
				(extra + c->codes.lens.litlen[sym]);
		static_cost += c->freqs.litlen[sym] *
				(extra + c->static_codes.lens.litlen[sym]);
	}

	/* Account for the cost of encoding offsets. */
	for (sym = 0; sym < ARRAY_LEN(deflate_extra_offset_bits); sym++) {
		u32 extra = deflate_extra_offset_bits[sym];

		dynamic_cost += c->freqs.offset[sym] *
				(extra + c->codes.lens.offset[sym]);
		static_cost += c->freqs.offset[sym] * (extra + 5);
	}

	/* Compute the cost of using uncompressed blocks. */
	uncompressed_cost += (-(bitcount + 3) & 7) + 32 +
			     (40 * (DIV_ROUND_UP(block_length,
						 UINT16_MAX) - 1)) +
			     (8 * block_length);

	/*
	 * Choose and output the cheapest type of block.  If there is a tie,
	 * prefer uncompressed, then static, then dynamic.
	 */

	best_cost = MIN(dynamic_cost, MIN(static_cost, uncompressed_cost));

	/* If the block isn't going to fit, then stop early. */
	if (DIV_ROUND_UP(bitcount + best_cost, 8) > os->end - out_next) {
		os->overflow = true;
		return;
	}
	/*
	 * Else, now we know that the block fits, so no further bounds checks on
	 * the output buffer are required until the next block.
	 */

	if (best_cost == uncompressed_cost) {
		/*
		 * Uncompressed block(s).  DEFLATE limits the length of
		 * uncompressed blocks to UINT16_MAX bytes, so if the length of
		 * the "block" we're flushing is over UINT16_MAX, we actually
		 * output multiple blocks.
		 */
		do {
			u8 bfinal = 0;
			size_t len = UINT16_MAX;

			if (in_end - in_next <= UINT16_MAX) {
				bfinal = is_final_block;
				len = in_end - in_next;
			}
			/* It was already checked that there is enough space. */
			ASSERT(os->end - out_next >=
			       DIV_ROUND_UP(bitcount + 3, 8) + 4 + len);
			/*
			 * Output BFINAL (1 bit) and BTYPE (2 bits), then align
			 * to a byte boundary.
			 */
			STATIC_ASSERT(DEFLATE_BLOCKTYPE_UNCOMPRESSED == 0);
			*out_next++ = (bfinal << bitcount) | bitbuf;
			if (bitcount > 5)
				*out_next++ = 0;
			bitbuf = 0;
			bitcount = 0;
			/* Output LEN and NLEN, then the data itself. */
			put_unaligned_le16(len, out_next);
			out_next += 2;
			put_unaligned_le16(~len, out_next);
			out_next += 2;
			memcpy(out_next, in_next, len);
			out_next += len;
			in_next += len;
		} while (in_next != in_end);
		/* Done outputting uncompressed block(s) */
		goto out;
	}

	if (best_cost == static_cost) {
		/* Static Huffman block */
		codes = &c->static_codes;
		ADD_BITS(is_final_block, 1);
		ADD_BITS(DEFLATE_BLOCKTYPE_STATIC_HUFFMAN, 2);
		FLUSH_BITS();
	} else {
		const unsigned num_explicit_lens = c->o.precode.num_explicit_lens;
		const unsigned num_precode_items = c->o.precode.num_items;
		unsigned precode_sym, precode_item;
		unsigned i;

		/* Dynamic Huffman block */

		codes = &c->codes;
		STATIC_ASSERT(CAN_BUFFER(1 + 2 + 5 + 5 + 4 + 3));
		ADD_BITS(is_final_block, 1);
		ADD_BITS(DEFLATE_BLOCKTYPE_DYNAMIC_HUFFMAN, 2);
		ADD_BITS(c->o.precode.num_litlen_syms - 257, 5);
		ADD_BITS(c->o.precode.num_offset_syms - 1, 5);
		ADD_BITS(num_explicit_lens - 4, 4);

		/* Output the lengths of the codewords in the precode. */
		if (CAN_BUFFER(3 * (DEFLATE_NUM_PRECODE_SYMS - 1))) {
			/*
			 * A 64-bit bitbuffer is just one bit too small to hold
			 * the maximum number of precode lens, so to minimize
			 * flushes we merge one len with the previous fields.
			 */
			precode_sym = deflate_precode_lens_permutation[0];
			ADD_BITS(c->o.precode.lens[precode_sym], 3);
			FLUSH_BITS();
			i = 1; /* num_explicit_lens >= 4 */
			do {
				precode_sym =
					deflate_precode_lens_permutation[i];
				ADD_BITS(c->o.precode.lens[precode_sym], 3);
			} while (++i < num_explicit_lens);
			FLUSH_BITS();
		} else {
			FLUSH_BITS();
			i = 0;
			do {
				precode_sym =
					deflate_precode_lens_permutation[i];
				ADD_BITS(c->o.precode.lens[precode_sym], 3);
				FLUSH_BITS();
			} while (++i < num_explicit_lens);
		}

		/*
		 * Output the lengths of the codewords in the litlen and offset
		 * codes, encoded by the precode.
		 */
		i = 0;
		do {
			precode_item = c->o.precode.items[i];
			precode_sym = precode_item & 0x1F;
			STATIC_ASSERT(CAN_BUFFER(MAX_PRE_CODEWORD_LEN + 7));
			ADD_BITS(c->o.precode.codewords[precode_sym],
				 c->o.precode.lens[precode_sym]);
			ADD_BITS(precode_item >> 5,
				 deflate_extra_precode_bits[precode_sym]);
			FLUSH_BITS();
		} while (++i < num_precode_items);
	}

	/* Output the literals and matches for a dynamic or static block. */
	ASSERT(bitcount <= 7);
	deflate_compute_full_len_codewords(c, codes);
#if SUPPORT_NEAR_OPTIMAL_PARSING
	if (sequences == NULL) {
		/* Output the literals and matches from the minimum-cost path */
		struct deflate_optimum_node *cur_node =
			&c->p.n.optimum_nodes[0];
		struct deflate_optimum_node * const end_node =
			&c->p.n.optimum_nodes[block_length];
		do {
			u32 length = cur_node->item & OPTIMUM_LEN_MASK;
			u32 offset = cur_node->item >> OPTIMUM_OFFSET_SHIFT;

			if (length == 1) {
				/* Literal */
				ADD_BITS(codes->codewords.litlen[offset],
					 codes->lens.litlen[offset]);
				FLUSH_BITS();
			} else {
				/* Match */
				WRITE_MATCH(c, codes, length, offset,
					    c->p.n.offset_slot_full[offset]);
			}
			cur_node += length;
		} while (cur_node != end_node);
	} else
#endif /* SUPPORT_NEAR_OPTIMAL_PARSING */
	{
		/* Output the literals and matches from the sequences list. */
		const struct deflate_sequence *seq;

		for (seq = sequences; ; seq++) {
			u32 litrunlen = seq->litrunlen_and_length &
					SEQ_LITRUNLEN_MASK;
			u32 length = seq->litrunlen_and_length >>
				     SEQ_LENGTH_SHIFT;
			unsigned lit;

			/* Output a run of literals. */
			if (CAN_BUFFER(4 * MAX_LITLEN_CODEWORD_LEN)) {
				for (; litrunlen >= 4; litrunlen -= 4) {
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					FLUSH_BITS();
				}
				if (litrunlen-- != 0) {
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					if (litrunlen-- != 0) {
						lit = *in_next++;
						ADD_BITS(codes->codewords.litlen[lit],
							 codes->lens.litlen[lit]);
						if (litrunlen-- != 0) {
							lit = *in_next++;
							ADD_BITS(codes->codewords.litlen[lit],
								 codes->lens.litlen[lit]);
						}
					}
					FLUSH_BITS();
				}
			} else {
				while (litrunlen--) {
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					FLUSH_BITS();
				}
			}

			if (length == 0) { /* Last sequence? */
				ASSERT(in_next == in_end);
				break;
			}

			/* Output a match. */
			WRITE_MATCH(c, codes, length, seq->offset,
				    seq->offset_slot);
			in_next += length;
		}
	}

	/* Output the end-of-block symbol. */
	ASSERT(bitcount <= 7);
	ADD_BITS(codes->codewords.litlen[DEFLATE_END_OF_BLOCK],
		 codes->lens.litlen[DEFLATE_END_OF_BLOCK]);
	FLUSH_BITS();
out:
	ASSERT(bitcount <= 7);
	/*
	 * Assert that the block cost was computed correctly.  This is relied on
	 * above for the bounds check on the output buffer.  Also,
	 * libdeflate_deflate_compress_bound() relies on this via the assumption
	 * that uncompressed blocks will always be used when cheapest.
	 */
	ASSERT(8 * (out_next - os->next) + bitcount - os->bitcount == best_cost);
	os->bitbuf = bitbuf;
	os->bitcount = bitcount;
	os->next = out_next;
}